

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O0

void Hex::Hexdumper_base::setbaseofs(ostream *os,uint64_t ofs)

{
  long lVar1;
  int __ix;
  uint64_t *puVar2;
  uint64_t ofs_local;
  ostream *os_local;
  
  lVar1 = *(long *)(*(long *)os + -0x18);
  __ix = __baseofs();
  puVar2 = (uint64_t *)std::ios_base::iword((ios_base *)(os + lVar1),__ix);
  *puVar2 = ofs;
  return;
}

Assistant:

static void setbaseofs(std::ostream& os, uint64_t ofs) { os.iword(__baseofs()) = ofs; }